

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O2

void Hacl_Impl_Ed25519_Ladder_point_mul(uint64_t *result,uint8_t *scalar,uint64_t *q1)

{
  uint64_t swap1_00;
  uint uVar1;
  uint64_t swap1;
  uint64_t *tmp5;
  uint64_t *nqpq;
  uint64_t *tmp6;
  uint64_t local_3a8;
  long lStack_3a0;
  long local_398;
  long lStack_390;
  long local_388;
  uint64_t local_380;
  long lStack_378;
  long local_370;
  long lStack_368;
  long local_360;
  uint64_t local_358;
  long lStack_350;
  long local_348;
  long lStack_340;
  long local_338;
  uint64_t local_330;
  long lStack_328;
  long local_320;
  long lStack_318;
  long local_310;
  uint64_t local_308;
  long lStack_300;
  long local_2f8;
  long lStack_2f0;
  long local_2e8;
  uint64_t auStack_2e0 [5];
  uint64_t local_2b8;
  long lStack_2b0;
  long local_2a8;
  long lStack_2a0;
  long local_298;
  uint64_t local_290;
  undefined1 auStack_288 [16];
  undefined1 auStack_278 [16];
  uint64_t local_268;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined8 local_220;
  uint64_t local_218 [5];
  uint64_t local_1f0 [5];
  uint64_t local_1c8 [5];
  uint64_t local_1a0 [5];
  uint64_t local_178 [5];
  uint64_t local_150 [5];
  uint64_t local_128 [5];
  uint64_t local_100 [5];
  uint64_t local_d8 [5];
  uint64_t local_b0 [5];
  uint64_t local_88 [5];
  uint64_t local_60 [6];
  
  memset(&local_2b8,0,0x280);
  local_290 = 1;
  auStack_288 = (undefined1  [16])0x0;
  auStack_278 = (undefined1  [16])0x0;
  local_268 = 1;
  local_260 = (undefined1  [16])0x0;
  local_250 = (undefined1  [16])0x0;
  local_240 = (undefined1  [16])0x0;
  local_230 = (undefined1  [16])0x0;
  local_220 = 0;
  memcpy(local_218,q1,0xa0);
  for (uVar1 = 0xff; uVar1 != 0xffffffff; uVar1 = uVar1 - 1) {
    swap1_00 = -(ulong)((scalar[uVar1 >> 3] >> (uVar1 & 7) & 1) != 0);
    Hacl_Impl_Ed25519_SwapConditional_swap_conditional_step
              (&local_2b8,local_218,&local_2b8,local_218,swap1_00);
    Hacl_Impl_Ed25519_SwapConditional_swap_conditional_step
              (&local_290,local_1f0,&local_290,local_1f0,swap1_00);
    Hacl_Impl_Ed25519_SwapConditional_swap_conditional_step
              (&local_268,local_1c8,&local_268,local_1c8,swap1_00);
    Hacl_Impl_Ed25519_SwapConditional_swap_conditional_step
              ((uint64_t *)local_240,local_1a0,(uint64_t *)local_240,local_1a0,swap1_00);
    memset(&local_3a8,0,0xf0);
    Hacl_Bignum25519_fsquare(&local_3a8,&local_2b8);
    Hacl_Bignum25519_fsquare(&local_380,&local_290);
    Hacl_Bignum25519_fsquare(&local_358,&local_268);
    local_310 = local_338 * 2;
    local_330 = local_358 * 2;
    lStack_328 = lStack_350 * 2;
    local_320 = local_348 * 2;
    lStack_318 = lStack_340 * 2;
    local_358 = local_380 + local_3a8;
    lStack_350 = lStack_378 + lStack_3a0;
    local_348 = local_370 + local_398;
    lStack_340 = lStack_368 + lStack_390;
    local_338 = local_388 + local_360;
    Hacl_Bignum25519_reduce_513(&local_358);
    local_308 = local_290 + local_2b8;
    lStack_300 = auStack_288._0_8_ + lStack_2b0;
    local_2f8 = auStack_288._8_8_ + local_2a8;
    lStack_2f0 = auStack_278._0_8_ + lStack_2a0;
    local_2e8 = local_298 + auStack_278._8_8_;
    Hacl_Bignum25519_fsquare(auStack_2e0,&local_308);
    local_2e8 = local_338;
    local_2f8 = local_348;
    lStack_2f0 = lStack_340;
    local_308 = local_358;
    lStack_300 = lStack_350;
    Hacl_Bignum25519_fdifference(auStack_2e0,&local_308);
    Hacl_Bignum25519_fdifference_reduced(&local_380,&local_3a8);
    Hacl_Bignum25519_reduce_513(&local_330);
    local_330 = local_380 + local_330;
    lStack_328 = lStack_378 + lStack_328;
    local_320 = local_320 + local_370;
    lStack_318 = lStack_318 + lStack_368;
    local_310 = local_310 + local_360;
    Hacl_Bignum_Fmul_fmul(local_178,&local_330,auStack_2e0);
    Hacl_Bignum_Fmul_fmul(local_150,&local_380,&local_358);
    Hacl_Bignum_Fmul_fmul(local_100,&local_358,auStack_2e0);
    Hacl_Bignum_Fmul_fmul(local_128,&local_330,&local_380);
    Hacl_Impl_Ed25519_PointAdd_point_add(local_d8,&local_2b8,local_218);
    Hacl_Impl_Ed25519_SwapConditional_swap_conditional_step
              (&local_2b8,local_218,local_178,local_d8,swap1_00);
    Hacl_Impl_Ed25519_SwapConditional_swap_conditional_step
              (&local_290,local_1f0,local_150,local_b0,swap1_00);
    Hacl_Impl_Ed25519_SwapConditional_swap_conditional_step
              (&local_268,local_1c8,local_128,local_88,swap1_00);
    Hacl_Impl_Ed25519_SwapConditional_swap_conditional_step
              ((uint64_t *)local_240,local_1a0,local_100,local_60,swap1_00);
  }
  memcpy(result,&local_2b8,0xa0);
  return;
}

Assistant:

static void Hacl_Impl_Ed25519_Ladder_point_mul(uint64_t *result, uint8_t *scalar, uint64_t *q1)
{
  uint64_t b[80U] = { 0U };
  uint64_t *nq = b;
  uint64_t *nqpq = b + (uint32_t)20U;
  Hacl_Impl_Ed25519_Ladder_make_point_inf(nq);
  Hacl_Impl_Ed25519_SwapConditional_copy(nqpq, q1);
  Hacl_Impl_Ed25519_Ladder_point_mul_(b, scalar);
  Hacl_Impl_Ed25519_SwapConditional_copy(result, nq);
}